

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-attitude-trajectory-reconstruction.hxx
# Opt level: O2

examples * __thiscall
stateObservation::examples::imuAttitudeTrajectoryReconstruction
          (examples *this,IndexedMatrixArray *y,Vector *xh0,Matrix *p,Matrix *q,Matrix *r,double dt)

{
  uint uVar1;
  uint uVar2;
  void *local_b8 [3];
  IndexedMatrixArray u;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_98 [80];
  ConstantReturnType local_48;
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u);
  uVar1 = IndexedMatrixArray::getFirstIndex(y);
  uVar1 = uVar1 - 1;
  while( true ) {
    uVar2 = IndexedMatrixArray::getLastIndex(y);
    if (uVar2 <= uVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_48,6,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_48);
    IndexedMatrixArray::setValue(&u,(Matrix *)local_b8,uVar1);
    free(local_b8[0]);
    uVar1 = uVar1 + 1;
  }
  imuAttitudeTrajectoryReconstruction(this,y,&u,xh0,p,q,r,dt);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_98);
  return this;
}

Assistant:

IndexedMatrixArray imuAttitudeTrajectoryReconstruction(
    const IndexedMatrixArray & y,
    const Vector & xh0,
    const Matrix & p,
    const Matrix & q,
    const Matrix & r,
    double dt)
{
    const unsigned inputSize=6;

    ///initialization of a zero input
    IndexedMatrixArray u;
    for (unsigned k=y.getFirstIndex()-1; k<y.getLastIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return imuAttitudeTrajectoryReconstruction (y, u, xh0, p, q, r, dt);
}